

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::Network(Network *this,Controller *controller)

{
  Config *pCVar1;
  Pools *listener;
  IStrategy *timeout;
  _func_int **repeat;
  Base *in_RSI;
  IJobResultListener *in_RDI;
  IStrategyListener *in_stack_00000010;
  Pools *in_stack_00000018;
  Pools *pools;
  IApiListener *in_stack_ffffffffffffff88;
  NetworkState *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 hwAES;
  IJobResultListener *in_stack_ffffffffffffffa0;
  
  hwAES = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  IJobResultListener::IJobResultListener(in_RDI);
  IStrategyListener::IStrategyListener((IStrategyListener *)(in_RDI + 1));
  IBaseListener::IBaseListener((IBaseListener *)(in_RDI + 2));
  ITimerListener::ITimerListener((ITimerListener *)(in_RDI + 3));
  IApiListener::IApiListener((IApiListener *)(in_RDI + 4));
  in_RDI->_vptr_IJobResultListener = (_func_int **)&PTR__Network_002b8780;
  in_RDI[1]._vptr_IJobResultListener = (_func_int **)&DAT_002b87e8;
  in_RDI[2]._vptr_IJobResultListener = (_func_int **)&PTR__Network_002b8830;
  in_RDI[3]._vptr_IJobResultListener = (_func_int **)&PTR__Network_002b8858;
  in_RDI[4]._vptr_IJobResultListener = (_func_int **)&PTR__Network_002b8880;
  in_RDI[5]._vptr_IJobResultListener = (_func_int **)in_RSI;
  in_RDI[6]._vptr_IJobResultListener = (_func_int **)0x0;
  NetworkState::NetworkState(in_stack_ffffffffffffff90);
  in_RDI[0x42]._vptr_IJobResultListener = (_func_int **)0x0;
  pCVar1 = Base::config(in_RSI);
  Config::cpu(pCVar1);
  CpuConfig::isHwAES((CpuConfig *)in_stack_ffffffffffffff90);
  JobResults::setListener(in_stack_ffffffffffffffa0,(bool)hwAES);
  Base::addListener((Base *)in_stack_ffffffffffffff90,(IBaseListener *)in_stack_ffffffffffffff88);
  Base::api(in_RSI);
  Api::addListener((Api *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pCVar1 = Base::config(in_RSI);
  listener = BaseConfig::pools(&pCVar1->super_BaseConfig);
  timeout = Pools::createStrategy(in_stack_00000018,in_stack_00000010);
  in_RDI[7]._vptr_IJobResultListener = (_func_int **)timeout;
  repeat = (_func_int **)operator_new(0x10);
  Timer::Timer((Timer *)pCVar1,(ITimerListener *)listener,(uint64_t)timeout,(uint64_t)repeat);
  in_RDI[0x42]._vptr_IJobResultListener = repeat;
  return;
}

Assistant:

xmrig::Network::Network(Controller *controller) :
    m_controller(controller),
    m_donate(nullptr),
    m_timer(nullptr)
{
    JobResults::setListener(this, controller->config()->cpu().isHwAES());
    controller->addListener(this);

#   ifdef XMRIG_FEATURE_API
    controller->api()->addListener(this);
#   endif

    const Pools &pools = controller->config()->pools();
    m_strategy = pools.createStrategy(this);

    m_timer = new Timer(this, kTickInterval, kTickInterval);
}